

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O1

void __thiscall
TStokesAnalytic::pressure<Fad<Fad<double>>>
          (TStokesAnalytic *this,TPZVec<Fad<Fad<double>_>_> *x,FADFADSTATE *p)

{
  FadUnaryMin<Fad<Fad<double>_>_> this_00;
  FADFADSTATE *pFVar1;
  Fad<double> *pFVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  Fad<Fad<double>_> *pFVar6;
  TPZVec<Fad<Fad<double>_>_> flux;
  FADFADSTATE x1;
  FADFADSTATE x2;
  FADFADSTATE fadRa;
  FADFADSTATE x3;
  undefined1 local_c68 [16];
  undefined8 uStack_c58;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *pFStack_c50;
  double dStack_c48;
  Vector<Fad<double>_> local_c40;
  Fad<double> FStack_c30;
  undefined1 local_c10 [24];
  FADFADSTATE *local_bf8;
  Vector<Fad<double>_> local_be8;
  Fad<double> local_bd8;
  undefined1 local_bb8 [24];
  Fad<Fad<double>_> *local_ba0;
  Vector<Fad<double>_> local_b90;
  Fad<double> local_b80;
  undefined1 local_b60 [24];
  Fad<Fad<double>_> *local_b48;
  FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_> local_b40;
  undefined1 local_b28 [24];
  Fad<Fad<double>_> *local_b10;
  REAL local_b08;
  undefined1 local_b00 [24];
  TPZVec<Fad<Fad<double>_>_> local_ae8;
  undefined1 local_ac8 [24];
  FADFADSTATE *local_ab0;
  Vector<Fad<double>_> local_aa0;
  Fad<double> local_a90;
  undefined1 local_a70 [24];
  Fad<Fad<double>_> local_a58;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>_>_>
  local_a00;
  undefined1 local_9f0 [24];
  Fad<double> local_9d8;
  Vector<Fad<double>_> local_9b8;
  Fad<double> local_9a8;
  Fad<Fad<double>_> local_988;
  FADFADSTATE local_930;
  FADFADSTATE local_8d8;
  FADFADSTATE local_880;
  FADFADSTATE local_828;
  FADFADSTATE local_7d0;
  FADFADSTATE local_778;
  FADFADSTATE local_720;
  FADFADSTATE local_6c8;
  FADFADSTATE local_670;
  Fad<Fad<double>_> local_618;
  Fad<Fad<double>_> local_5c0;
  Fad<Fad<double>_> local_568;
  Fad<Fad<double>_> local_510;
  FADFADSTATE local_4b8;
  FADFADSTATE local_460;
  FADFADSTATE local_408;
  FADFADSTATE local_3b0;
  FADFADSTATE local_358;
  Fad<Fad<double>_> local_300;
  Fad<Fad<double>_> local_2a8;
  Fad<Fad<double>_> local_250;
  Fad<Fad<double>_> local_1f8;
  FADFADSTATE local_1a0;
  Fad<Fad<double>_> local_148;
  Fad<Fad<double>_> local_f0;
  Fad<Fad<double>_> local_98;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>
  local_40;
  
  Fad<Fad<double>_>::Fad(&local_a58,x->fStore);
  this_00.expr_ = (Fad<Fad<double>_> *)(local_9f0 + 0x10);
  Fad<Fad<double>_>::Fad(this_00.expr_,x->fStore + 1);
  Fad<Fad<double>_>::Fad(&local_98,x->fStore + 2);
  local_988.val_.val_ = 0.0;
  local_988.val_.dx_.num_elts = 0;
  local_988.defaultVal.dx_.ptr_to_data = (double *)0x0;
  local_988.defaultVal.defaultVal = 0.0;
  local_988.val_.dx_.ptr_to_data = (double *)0x0;
  local_988.val_.defaultVal = 0.0;
  local_988.dx_.num_elts = 0;
  local_988.dx_.ptr_to_data = (Fad<double> *)0x0;
  local_988.defaultVal.val_ = 0.0;
  local_988.defaultVal.dx_.num_elts = 0;
  TPZVec<Fad<Fad<double>_>_>::TPZVec(&local_ae8,3,&local_988);
  Fad<double>::~Fad(&local_988.defaultVal);
  Vector<Fad<double>_>::~Vector(&local_988.dx_);
  Fad<double>::~Fad(&local_988.val_);
  dVar4 = local_9d8.val_;
  local_988.val_.val_ = this->multRa;
  local_988.val_.dx_.num_elts = 0;
  local_988.defaultVal.dx_.ptr_to_data = (double *)0x0;
  local_988.defaultVal.defaultVal = 0.0;
  local_988.val_.dx_.ptr_to_data = (double *)0x0;
  local_988.val_.defaultVal = 0.0;
  local_988.dx_.num_elts = 0;
  local_988.dx_.ptr_to_data = (Fad<double> *)0x0;
  local_988.defaultVal.val_ = 0.0;
  local_988.defaultVal.dx_.num_elts = 0;
  switch(this->fExactSol) {
  case EKovasznay:
    dVar5 = 1.0 / this->fvisco;
    dVar4 = this->Pi * 4.0 * this->Pi + dVar5 * dVar5 * 0.25;
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    dVar4 = dVar5 * 0.5 - dVar4;
    local_bb8._8_8_ = dVar4 + dVar4;
    local_bb8._16_8_ = 0.0;
    local_ba0 = &local_a58;
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              ((Fad<Fad<double>> *)&local_778,
               (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)local_bb8);
    FADexp((FADFADSTATE *)local_c68,&local_778);
    local_c10._8_8_ =
         (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)0xbfe0000000000000;
    local_c10._16_8_ = 0.0;
    local_bf8 = (FADFADSTATE *)local_c68;
    Fad<Fad<double>>::operator=
              ((Fad<Fad<double>> *)p,
               (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)local_c10);
    Fad<double>::~Fad(&FStack_c30);
    Vector<Fad<double>_>::~Vector(&local_c40);
    Fad<double>::~Fad((Fad<double> *)(local_c68 + 8));
    Fad<double>::~Fad(&local_778.defaultVal);
    Vector<Fad<double>_>::~Vector(&local_778.dx_);
    pFVar2 = &local_778.val_;
    break;
  case EKovasznayCDG:
    dVar5 = 1.0 / this->fvisco;
    dVar4 = this->Pi * 4.0 * this->Pi + dVar5 * dVar5 * 0.25;
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    pFVar6 = (Fad<Fad<double>_> *)(dVar5 * 0.5 - dVar4);
    local_ac8._16_8_ = (double *)0x0;
    local_ab0 = &local_a58;
    local_ac8._8_8_ = pFVar6;
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              ((Fad<Fad<double>> *)&local_7d0,
               (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)local_ac8);
    FADexp((FADFADSTATE *)local_c68,&local_7d0);
    local_b28._8_8_ = this->Pi + this->Pi;
    local_b28._16_8_ = (double *)0x0;
    local_b10 = this_00.expr_;
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              ((Fad<Fad<double>> *)&local_828,
               (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)local_b28);
    FADcos((FADFADSTATE *)local_c10,&local_828);
    local_ba0 = (Fad<Fad<double>_> *)local_b60;
    local_bb8._8_8_ = (Fad<Fad<double>_> *)0x3ff0000000000000;
    local_bb8._16_8_ = 0.0;
    local_b60._0_8_ = (FADFADSTATE *)local_c68;
    local_b60._8_8_ = (FADFADSTATE *)local_c10;
    Fad<Fad<double>>::operator=
              ((Fad<Fad<double>> *)local_ae8.fStore,
               (FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>
                *)local_bb8);
    Fad<double>::~Fad(&local_bd8);
    Vector<Fad<double>_>::~Vector(&local_be8);
    Fad<double>::~Fad((Fad<double> *)(local_c10 + 8));
    Fad<double>::~Fad(&local_828.defaultVal);
    Vector<Fad<double>_>::~Vector(&local_828.dx_);
    Fad<double>::~Fad(&local_828.val_);
    Fad<double>::~Fad(&FStack_c30);
    Vector<Fad<double>_>::~Vector(&local_c40);
    Fad<double>::~Fad((Fad<double> *)(local_c68 + 8));
    Fad<double>::~Fad(&local_7d0.defaultVal);
    Vector<Fad<double>_>::~Vector(&local_7d0.dx_);
    Fad<double>::~Fad(&local_7d0.val_);
    local_b08 = this->Pi;
    local_ac8._16_8_ = (double *)0x0;
    local_ab0 = &local_a58;
    local_ac8._8_8_ = pFVar6;
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              ((Fad<Fad<double>> *)&local_880,
               (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)local_ac8);
    FADexp((FADFADSTATE *)local_c68,&local_880);
    local_bb8._8_8_ = (double)pFVar6 / (local_b08 + local_b08);
    local_bb8._16_8_ = 0.0;
    local_b28._8_8_ = this->Pi + this->Pi;
    local_b28._16_8_ = (double *)0x0;
    local_ba0 = (FADFADSTATE *)local_c68;
    local_b10 = this_00.expr_;
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              ((Fad<Fad<double>> *)&local_8d8,
               (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)local_b28);
    FADsin((FADFADSTATE *)local_c10,&local_8d8);
    local_b60._0_8_ = local_bb8;
    local_b60._8_8_ = (FADFADSTATE *)local_c10;
    Fad<Fad<double>>::operator=
              ((Fad<Fad<double>> *)(local_ae8.fStore + 1),
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
                *)local_b60);
    Fad<double>::~Fad(&local_bd8);
    Vector<Fad<double>_>::~Vector(&local_be8);
    Fad<double>::~Fad((Fad<double> *)(local_c10 + 8));
    Fad<double>::~Fad(&local_8d8.defaultVal);
    Vector<Fad<double>_>::~Vector(&local_8d8.dx_);
    Fad<double>::~Fad(&local_8d8.val_);
    Fad<double>::~Fad(&FStack_c30);
    Vector<Fad<double>_>::~Vector(&local_c40);
    Fad<double>::~Fad((Fad<double> *)(local_c68 + 8));
    Fad<double>::~Fad(&local_880.defaultVal);
    Vector<Fad<double>_>::~Vector(&local_880.dx_);
    Fad<double>::~Fad(&local_880.val_);
    local_bb8._8_8_ = (double)pFVar6 + (double)pFVar6;
    local_bb8._16_8_ = 0.0;
    local_ba0 = &local_a58;
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              ((Fad<Fad<double>> *)&local_930,
               (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)local_bb8);
    FADexp((FADFADSTATE *)local_c68,&local_930);
    local_c10._8_8_ = -0.5;
    local_c10._16_8_ = 0.0;
    local_bf8 = (FADFADSTATE *)local_c68;
    Fad<Fad<double>>::operator=
              ((Fad<Fad<double>> *)p,
               (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)local_c10);
    Fad<double>::~Fad(&FStack_c30);
    Vector<Fad<double>_>::~Vector(&local_c40);
    Fad<double>::~Fad((Fad<double> *)(local_c68 + 8));
    Fad<double>::~Fad(&local_930.defaultVal);
    Vector<Fad<double>_>::~Vector(&local_930.dx_);
    Fad<double>::~Fad(&local_930.val_);
    local_bb8._0_8_ = local_ae8.fStore;
    local_bb8._8_8_ = local_ae8.fStore;
    local_ac8._0_8_ = local_ae8.fStore + 1;
    local_c68._8_8_ = 0.5;
    uStack_c58 = (double *)0x0;
    pFStack_c50 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)local_c10;
    local_c10._0_8_ = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)local_bb8;
    local_c10._8_8_ = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)local_ac8;
    local_ac8._8_8_ = local_ac8._0_8_;
    Fad<Fad<double>>::operator+=
              ((Fad<Fad<double>> *)p,
               (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>_>_>
                *)local_c68);
    goto LAB_013f122a;
  case ESinCos:
  case ESinCosBDS:
    Fad<Fad<double>_>::Fad(&local_f0,&local_a58);
    FADcos((FADFADSTATE *)local_c68,&local_f0);
    Fad<Fad<double>_>::Fad(&local_148,(Fad<Fad<double>_> *)(local_9f0 + 0x10));
    FADsin((FADFADSTATE *)local_c10,&local_148);
    local_bb8._0_8_ = (FADFADSTATE *)local_c68;
    local_bb8._8_8_ = (FADFADSTATE *)local_c10;
    Fad<Fad<double>>::operator=
              ((Fad<Fad<double>> *)p,
               (FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *)local_bb8);
    Fad<double>::~Fad(&local_bd8);
    Vector<Fad<double>_>::~Vector(&local_be8);
    Fad<double>::~Fad((Fad<double> *)(local_c10 + 8));
    Fad<double>::~Fad(&local_148.defaultVal);
    Vector<Fad<double>_>::~Vector(&local_148.dx_);
    Fad<double>::~Fad(&local_148.val_);
    Fad<double>::~Fad(&FStack_c30);
    Vector<Fad<double>_>::~Vector(&local_c40);
    Fad<double>::~Fad((Fad<double> *)(local_c68 + 8));
    Fad<double>::~Fad(&local_f0.defaultVal);
    Vector<Fad<double>_>::~Vector(&local_f0.dx_);
    pFVar2 = &local_f0.val_;
    break;
  case ENoFlow:
    Fad<Fad<double>_>::Fad((Fad<Fad<double>_> *)local_c68,&local_988);
    local_b00._0_8_ = &local_b40;
    local_b60._0_8_ = local_b00;
    local_bb8._0_8_ = local_a70;
    local_b60._8_8_ = local_bb8;
    local_bb8._8_8_ = (FADFADSTATE *)0x4000000000000000;
    local_bb8._16_8_ = 0.0;
    local_b28._0_8_ = local_b60;
    local_c10._0_8_ = local_b28;
    local_ac8._8_8_ = local_c10;
    local_c10._8_8_ =
         (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)0x3fe2aaaaaaaaaaab;
    local_c10._16_8_ = 0.0;
    local_b40.fadexpr_.left_ = this_00.expr_;
    local_b40.fadexpr_.right_.constant_ = (double)this_00.expr_;
    local_b28._8_8_ = this_00.expr_;
    local_b00._8_8_ = this_00.expr_;
    local_ac8._0_8_ = (Fad<Fad<double>_> *)local_c68;
    local_a70._0_8_ = this_00.expr_;
    local_a70._8_8_ = this_00.expr_;
    Fad<Fad<double>>::operator=
              ((Fad<Fad<double>> *)p,
               (FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>
                *)local_ac8);
    Fad<double>::~Fad(&FStack_c30);
    Vector<Fad<double>_>::~Vector(&local_c40);
    pFVar2 = (Fad<double> *)(local_c68 + 8);
    break;
  case ESinCos3D:
  case ESinCosBDS3D:
    Fad<Fad<double>_>::Fad(&local_510,&local_a58);
    FADcos((FADFADSTATE *)local_c68,&local_510);
    Fad<Fad<double>_>::Fad(&local_568,(Fad<Fad<double>_> *)(local_9f0 + 0x10));
    FADsin((FADFADSTATE *)local_c10,&local_568);
    local_b60._0_8_ = (FADFADSTATE *)local_c68;
    local_b60._8_8_ = (FADFADSTATE *)local_c10;
    Fad<Fad<double>_>::Fad(&local_5c0,(Fad<Fad<double>_> *)(local_9f0 + 0x10));
    FADcos((Fad<Fad<double>_> *)local_bb8,&local_5c0);
    Fad<Fad<double>_>::Fad(&local_618,&local_98);
    FADsin((FADFADSTATE *)local_ac8,&local_618);
    local_b28._8_8_ = local_b00;
    local_b28._0_8_ = local_b60;
    local_b00._0_8_ = (Fad<Fad<double>_> *)local_bb8;
    local_b00._8_8_ = (FADFADSTATE *)local_ac8;
    Fad<Fad<double>>::operator=
              ((Fad<Fad<double>> *)p,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>
                *)local_b28);
    Fad<double>::~Fad(&local_a90);
    Vector<Fad<double>_>::~Vector(&local_aa0);
    Fad<double>::~Fad((Fad<double> *)(local_ac8 + 8));
    Fad<double>::~Fad(&local_618.defaultVal);
    Vector<Fad<double>_>::~Vector(&local_618.dx_);
    Fad<double>::~Fad(&local_618.val_);
    Fad<double>::~Fad(&local_b80);
    Vector<Fad<double>_>::~Vector(&local_b90);
    Fad<double>::~Fad((Fad<double> *)(local_bb8 + 8));
    Fad<double>::~Fad(&local_5c0.defaultVal);
    Vector<Fad<double>_>::~Vector(&local_5c0.dx_);
    Fad<double>::~Fad(&local_5c0.val_);
    Fad<double>::~Fad(&local_bd8);
    Vector<Fad<double>_>::~Vector(&local_be8);
    Fad<double>::~Fad((Fad<double> *)(local_c10 + 8));
    Fad<double>::~Fad(&local_568.defaultVal);
    Vector<Fad<double>_>::~Vector(&local_568.dx_);
    Fad<double>::~Fad(&local_568.val_);
    Fad<double>::~Fad(&FStack_c30);
    Vector<Fad<double>_>::~Vector(&local_c40);
    Fad<double>::~Fad((Fad<double> *)(local_c68 + 8));
    Fad<double>::~Fad(&local_510.defaultVal);
    Vector<Fad<double>_>::~Vector(&local_510.dx_);
    pFVar2 = &local_510.val_;
    break;
  case EPconst:
    (p->val_).val_ = 0.0;
    if ((p->val_).dx_.num_elts != 0) {
      local_c68._0_8_ = 0.0;
      Vector<double>::operator=(&(p->val_).dx_,(double *)local_c68);
    }
    if ((p->dx_).num_elts == 0) goto LAB_013f122a;
    local_c68._0_8_ = 0.0;
    local_c68._8_8_ = local_c68._8_8_ & 0xffffffff00000000;
    uStack_c58 = (double *)0x0;
    pFStack_c50 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)0x0;
    Vector<Fad<double>_>::operator=(&p->dx_,(Fad<double> *)local_c68);
    pFVar2 = (Fad<double> *)local_c68;
    break;
  default:
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZAnalyticSolution.cpp"
               ,0x988);
  case EGatica3D:
    local_ac8._8_8_ = this->Pi;
    local_ac8._16_8_ = (double *)0x0;
    local_ab0 = &local_a58;
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              ((Fad<Fad<double>> *)&local_670,
               (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)local_ac8);
    FADsin((FADFADSTATE *)local_c68,&local_670);
    local_b28._8_8_ = this->Pi;
    local_b28._16_8_ = (double *)0x0;
    local_b10 = this_00.expr_;
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              ((Fad<Fad<double>> *)&local_6c8,
               (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)local_b28);
    FADsin((FADFADSTATE *)local_c10,&local_6c8);
    local_b60._8_8_ = this->Pi;
    local_b60._16_8_ = 0.0;
    local_b48 = &local_98;
    local_b40.fadexpr_.left_ = (FADFADSTATE *)local_c68;
    local_b40.fadexpr_.right_.constant_ = (double)local_c10;
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              ((Fad<Fad<double>> *)&local_720,
               (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)local_b60);
    FADsin((FADFADSTATE *)local_bb8,&local_720);
    local_b00._0_8_ = &local_b40;
    local_b00._8_8_ = (FADFADSTATE *)local_bb8;
    Fad<Fad<double>>::operator=
              ((Fad<Fad<double>> *)p,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
                *)local_b00);
    Fad<double>::~Fad(&local_b80);
    Vector<Fad<double>_>::~Vector(&local_b90);
    Fad<double>::~Fad((Fad<double> *)(local_bb8 + 8));
    Fad<double>::~Fad(&local_720.defaultVal);
    Vector<Fad<double>_>::~Vector(&local_720.dx_);
    Fad<double>::~Fad(&local_720.val_);
    Fad<double>::~Fad(&local_bd8);
    Vector<Fad<double>_>::~Vector(&local_be8);
    Fad<double>::~Fad((Fad<double> *)(local_c10 + 8));
    Fad<double>::~Fad(&local_6c8.defaultVal);
    Vector<Fad<double>_>::~Vector(&local_6c8.dx_);
    Fad<double>::~Fad(&local_6c8.val_);
    Fad<double>::~Fad(&FStack_c30);
    Vector<Fad<double>_>::~Vector(&local_c40);
    Fad<double>::~Fad((Fad<double> *)(local_c68 + 8));
    Fad<double>::~Fad(&local_670.defaultVal);
    Vector<Fad<double>_>::~Vector(&local_670.dx_);
    pFVar2 = &local_670.val_;
    break;
  case ECouplingSD:
    local_c68._8_8_ = 0.0;
    uStack_c58 = (double *)((ulong)uStack_c58._4_4_ << 0x20);
    FStack_c30.dx_.ptr_to_data = (double *)0x0;
    FStack_c30.defaultVal = 0.0;
    pFStack_c50 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)0x0;
    dStack_c48 = 0.0;
    local_c40.num_elts = 0;
    local_c40.ptr_to_data = (Fad<double> *)0x0;
    FStack_c30.val_ = 0.0;
    FStack_c30.dx_.num_elts = 0;
    Fad<double>::~Fad(&FStack_c30);
    Vector<Fad<double>_>::~Vector(&local_c40);
    Fad<double>::~Fad((Fad<double> *)(local_c68 + 8));
    if (0.0 <= dVar4) {
      local_c68._8_8_ = 0.0;
      uStack_c58 = (double *)((ulong)uStack_c58 & 0xffffffff00000000);
      FStack_c30.dx_.ptr_to_data = (double *)0x0;
      FStack_c30.defaultVal = 0.0;
      pFStack_c50 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)0x0;
      dStack_c48 = 0.0;
      local_c40.num_elts = 0;
      local_c40.ptr_to_data = (Fad<double> *)0x0;
      FStack_c30.val_ = 0.0;
      FStack_c30.dx_.num_elts = 0;
      Fad<double>::~Fad(&FStack_c30);
      Vector<Fad<double>_>::~Vector(&local_c40);
      Fad<double>::~Fad((Fad<double> *)(local_c68 + 8));
      if (local_9d8.val_ < 0.0) goto LAB_013f122a;
      Fad<Fad<double>_>::Fad(&local_2a8,&local_a58);
      FADsin((FADFADSTATE *)local_c68,&local_2a8);
      Fad<Fad<double>_>::Fad(&local_300,(Fad<Fad<double>_> *)(local_9f0 + 0x10));
      FADsin((FADFADSTATE *)local_c10,&local_300);
      local_bb8._0_8_ = (FADFADSTATE *)local_c68;
      local_bb8._8_8_ = (FADFADSTATE *)local_c10;
      Fad<Fad<double>>::operator=
                ((Fad<Fad<double>> *)p,
                 (FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *)local_bb8);
      Fad<double>::~Fad(&local_bd8);
      Vector<Fad<double>_>::~Vector(&local_be8);
      Fad<double>::~Fad((Fad<double> *)(local_c10 + 8));
      Fad<double>::~Fad(&local_300.defaultVal);
      Vector<Fad<double>_>::~Vector(&local_300.dx_);
      Fad<double>::~Fad(&local_300.val_);
      Fad<double>::~Fad(&FStack_c30);
      Vector<Fad<double>_>::~Vector(&local_c40);
      Fad<double>::~Fad((Fad<double> *)(local_c68 + 8));
      Fad<double>::~Fad(&local_2a8.defaultVal);
      Vector<Fad<double>_>::~Vector(&local_2a8.dx_);
      pFVar2 = &local_2a8.val_;
    }
    else {
      local_b00._0_8_ = this_00.expr_;
      Fad<Fad<double>>::Fad<FadUnaryMin<Fad<Fad<double>>>>
                ((Fad<Fad<double>> *)&local_1a0,
                 (FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_> *)local_b00);
      FADexp((FADFADSTATE *)local_c68,&local_1a0);
      local_b60._0_8_ = (FADFADSTATE *)local_c68;
      Fad<Fad<double>_>::Fad(&local_1f8,(Fad<Fad<double>_> *)(local_9f0 + 0x10));
      FADexp((FADFADSTATE *)local_c10,&local_1f8);
      local_b28._0_8_ = local_b60;
      local_b28._8_8_ = (FADFADSTATE *)local_c10;
      Fad<Fad<double>_>::Fad(&local_250,&local_a58);
      FADsin((FADFADSTATE *)local_bb8,&local_250);
      local_ac8._0_8_ = local_b28;
      local_ac8._8_8_ = (FADFADSTATE *)local_bb8;
      Fad<Fad<double>>::operator=
                ((Fad<Fad<double>> *)p,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
                  *)local_ac8);
      Fad<double>::~Fad(&local_b80);
      Vector<Fad<double>_>::~Vector(&local_b90);
      Fad<double>::~Fad((Fad<double> *)(local_bb8 + 8));
      Fad<double>::~Fad(&local_250.defaultVal);
      Vector<Fad<double>_>::~Vector(&local_250.dx_);
      Fad<double>::~Fad(&local_250.val_);
      Fad<double>::~Fad(&local_bd8);
      Vector<Fad<double>_>::~Vector(&local_be8);
      Fad<double>::~Fad((Fad<double> *)(local_c10 + 8));
      Fad<double>::~Fad(&local_1f8.defaultVal);
      Vector<Fad<double>_>::~Vector(&local_1f8.dx_);
      Fad<double>::~Fad(&local_1f8.val_);
      Fad<double>::~Fad(&FStack_c30);
      Vector<Fad<double>_>::~Vector(&local_c40);
      Fad<double>::~Fad((Fad<double> *)(local_c68 + 8));
      Fad<double>::~Fad(&local_1a0.defaultVal);
      Vector<Fad<double>_>::~Vector(&local_1a0.dx_);
      pFVar2 = &local_1a0.val_;
    }
    break;
  case ECouplingNSD:
    local_c68._8_8_ = 1.0;
    uStack_c58 = (double *)((ulong)uStack_c58._4_4_ << 0x20);
    FStack_c30.dx_.ptr_to_data = (double *)0x0;
    FStack_c30.defaultVal = 0.0;
    pFStack_c50 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)0x0;
    dStack_c48 = 0.0;
    local_c40.num_elts = 0;
    local_c40.ptr_to_data = (Fad<double> *)0x0;
    FStack_c30.val_ = 0.0;
    FStack_c30.dx_.num_elts = 0;
    Fad<double>::~Fad(&FStack_c30);
    Vector<Fad<double>_>::~Vector(&local_c40);
    Fad<double>::~Fad((Fad<double> *)(local_c68 + 8));
    if (1.0 <= dVar4) {
      local_c68._8_8_ = 1.0;
      uStack_c58 = (double *)((ulong)uStack_c58 & 0xffffffff00000000);
      FStack_c30.dx_.ptr_to_data = (double *)0x0;
      FStack_c30.defaultVal = 0.0;
      pFStack_c50 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)0x0;
      dStack_c48 = 0.0;
      local_c40.num_elts = 0;
      local_c40.ptr_to_data = (Fad<double> *)0x0;
      FStack_c30.val_ = 0.0;
      FStack_c30.dx_.num_elts = 0;
      Fad<double>::~Fad(&FStack_c30);
      Vector<Fad<double>_>::~Vector(&local_c40);
      Fad<double>::~Fad((Fad<double> *)(local_c68 + 8));
      if (local_9d8.val_ < 1.0) goto LAB_013f122a;
      pFVar1 = (FADFADSTATE *)this->Pi;
      local_b00._0_8_ = local_b28;
      local_b28._16_8_ = (double *)0x0;
      local_b10 = &local_a58;
      local_b00._8_8_ = (Fad<Fad<double>_> *)0x4000000000000000;
      local_b00._16_8_ = 0.0;
      local_b28._8_8_ = pFVar1;
      Fad<Fad<double>>::
      Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>,FadCst<double>>>
                ((Fad<Fad<double>> *)&local_408,
                 (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>
                  *)local_b00);
      FADcos((FADFADSTATE *)local_c68,&local_408);
      local_ac8._8_8_ = (double)pFVar1 * 0.25;
      local_ac8._16_8_ = (double *)0x0;
      local_b40.fadexpr_.right_.constant_ = 1.0;
      local_b40.fadexpr_.right_.defaultVal = 0.0;
      local_b60._8_8_ = this->Pi;
      local_b60._16_8_ = 0.0;
      local_b48 = this_00.expr_;
      local_b40.fadexpr_.left_ = this_00.expr_;
      local_ab0 = (FADFADSTATE *)local_c68;
      Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
                ((Fad<Fad<double>> *)&local_460,
                 (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)local_b60);
      FADcos((FADFADSTATE *)local_c10,&local_460);
      local_40.fadexpr_.left_ = &local_b40;
      local_a00.fadexpr_.right_ = &local_40;
      local_a00.fadexpr_.left_ =
           (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)local_ac8;
      local_a70._8_8_ = (FADFADSTATE *)0x3ff0000000000000;
      local_a70._16_8_ = 0.0;
      local_a70._0_8_ = this_00.expr_;
      local_40.fadexpr_.right_ = (FADFADSTATE *)local_c10;
      Fad<Fad<double>>::Fad<FadBinaryMinus<Fad<Fad<double>>,FadCst<double>>>
                ((Fad<Fad<double>> *)&local_4b8,
                 (FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_> *)local_a70);
      FADsin((FADFADSTATE *)local_bb8,&local_4b8);
      local_9f0._0_8_ = &local_a00;
      local_9f0._8_8_ = (FADFADSTATE *)local_bb8;
      Fad<Fad<double>>::operator=
                ((Fad<Fad<double>> *)p,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>
                  *)local_9f0);
      Fad<double>::~Fad(&local_b80);
      Vector<Fad<double>_>::~Vector(&local_b90);
      Fad<double>::~Fad((Fad<double> *)(local_bb8 + 8));
      Fad<double>::~Fad(&local_4b8.defaultVal);
      Vector<Fad<double>_>::~Vector(&local_4b8.dx_);
      Fad<double>::~Fad(&local_4b8.val_);
      Fad<double>::~Fad(&local_bd8);
      Vector<Fad<double>_>::~Vector(&local_be8);
      Fad<double>::~Fad((Fad<double> *)(local_c10 + 8));
      Fad<double>::~Fad(&local_460.defaultVal);
      Vector<Fad<double>_>::~Vector(&local_460.dx_);
      Fad<double>::~Fad(&local_460.val_);
      Fad<double>::~Fad(&FStack_c30);
      Vector<Fad<double>_>::~Vector(&local_c40);
      Fad<double>::~Fad((Fad<double> *)(local_c68 + 8));
      Fad<double>::~Fad(&local_408.defaultVal);
      Vector<Fad<double>_>::~Vector(&local_408.dx_);
      pFVar2 = &local_408.val_;
    }
    else {
      local_bb8._8_8_ = this->Pi;
      local_b60._0_8_ = local_bb8;
      local_bb8._16_8_ = 0.0;
      local_9f0._0_8_ = local_b60;
      local_b60._8_8_ = (FADFADSTATE *)0x4010000000000000;
      local_b60._16_8_ = 0.0;
      local_b00._0_8_ = local_ac8;
      local_ac8._16_8_ = (double *)0x0;
      local_ab0 = &local_a58;
      local_b00._8_8_ = (Fad<Fad<double>_> *)0x4000000000000000;
      local_b00._16_8_ = 0.0;
      local_ba0 = this_00.expr_;
      local_ac8._8_8_ = local_bb8._8_8_;
      Fad<Fad<double>>::
      Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>,FadCst<double>>>
                ((Fad<Fad<double>> *)&local_358,
                 (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>
                  *)local_b00);
      FADcos((FADFADSTATE *)local_c68,&local_358);
      local_a70._0_8_ = local_9f0;
      local_b28._8_8_ = (FADFADSTATE *)0x3ff0000000000000;
      local_b28._16_8_ = (double *)0x0;
      local_b10 = this_00.expr_;
      local_a70._8_8_ = (FADFADSTATE *)local_c68;
      Fad<Fad<double>>::Fad<FadBinaryMinus<FadCst<double>,Fad<Fad<double>>>>
                ((Fad<Fad<double>> *)&local_3b0,
                 (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_>_> *)local_b28);
      FADsin((FADFADSTATE *)local_c10,&local_3b0);
      local_b40.fadexpr_.left_ = (Fad<Fad<double>_> *)local_a70;
      local_b40.fadexpr_.right_.constant_ = (double)local_c10;
      Fad<Fad<double>>::operator=
                ((Fad<Fad<double>> *)p,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
                  *)&local_b40);
      Fad<double>::~Fad(&local_bd8);
      Vector<Fad<double>_>::~Vector(&local_be8);
      Fad<double>::~Fad((Fad<double> *)(local_c10 + 8));
      Fad<double>::~Fad(&local_3b0.defaultVal);
      Vector<Fad<double>_>::~Vector(&local_3b0.dx_);
      Fad<double>::~Fad(&local_3b0.val_);
      Fad<double>::~Fad(&FStack_c30);
      Vector<Fad<double>_>::~Vector(&local_c40);
      Fad<double>::~Fad((Fad<double> *)(local_c68 + 8));
      Fad<double>::~Fad(&local_358.defaultVal);
      Vector<Fad<double>_>::~Vector(&local_358.dx_);
      pFVar2 = &local_358.val_;
    }
  }
  Fad<double>::~Fad(pFVar2);
LAB_013f122a:
  Fad<double>::~Fad(&local_988.defaultVal);
  Vector<Fad<double>_>::~Vector(&local_988.dx_);
  Fad<double>::~Fad(&local_988.val_);
  local_ae8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01a08cc8;
  if (local_ae8.fStore != (FADFADSTATE *)0x0) {
    dVar4 = local_ae8.fStore[-1].defaultVal.defaultVal;
    if (dVar4 != 0.0) {
      pFVar1 = local_ae8.fStore + (long)dVar4 + -1;
      lVar3 = (long)dVar4 * -0x58;
      do {
        pFVar2 = &pFVar1->val_;
        Fad<double>::~Fad((Fad<double> *)((Vector<Fad<double>_> *)(pFVar2 + 1) + 1));
        Vector<Fad<double>_>::~Vector((Vector<Fad<double>_> *)(pFVar2 + 1));
        Fad<double>::~Fad(pFVar2);
        pFVar1 = (FADFADSTATE *)(pFVar2 + -3);
        lVar3 = lVar3 + 0x58;
      } while (lVar3 != 0);
    }
    operator_delete__(&local_ae8.fStore[-1].defaultVal.defaultVal,(long)dVar4 * 0x58 + 8);
  }
  Fad<double>::~Fad(&local_98.defaultVal);
  Vector<Fad<double>_>::~Vector(&local_98.dx_);
  Fad<double>::~Fad(&local_98.val_);
  Fad<double>::~Fad(&local_9a8);
  Vector<Fad<double>_>::~Vector(&local_9b8);
  Fad<double>::~Fad(&local_9d8);
  Fad<double>::~Fad(&local_a58.defaultVal);
  Vector<Fad<double>_>::~Vector(&local_a58.dx_);
  Fad<double>::~Fad(&local_a58.val_);
  return;
}

Assistant:

void TStokesAnalytic::pressure(const TPZVec<FADFADSTATE > &x, FADFADSTATE &p) const
{
    FADFADSTATE x1 = x[0];
    FADFADSTATE x2 = x[1];
    FADFADSTATE x3 = x[2];
    TPZVec<FADFADSTATE > flux(3,0.);
    REAL Re = 0.;
    REAL lambda = 0.;
    FADFADSTATE fadRa = multRa;    

    switch(fExactSol)
    {
        case ESinCos:
        case ESinCosBDS:
            p = FADcos(x1)*FADsin(x2);
            break;
        case ENoFlow:
            p = (FADFADSTATE) fadRa*(x2*x2*x2-(x2*x2)/2.+x2-7./12.);
            break;
	case ECouplingSD:
	    if(x2< (FADFADSTATE) 0.){
		p = (-FADexp(-x2)+FADexp(x2))*FADsin(x1);		
	    }else if(x2>= (FADFADSTATE) 0.){
		p = FADsin(x1)*FADsin(x2);
	    }
	    break;
	case ECouplingNSD:
	    if(x2< (FADFADSTATE)1.){
		p = -(Pi*x2/4.)*FADcos(Pi*x1/2.)*FADsin(1.-x2);		
	    }else if(x2>= (FADFADSTATE)1.){
                p = (Pi/4.)*FADcos(Pi*x1/2.)*(x2-1.-FADcos(Pi*x2))*FADsin(x2-1.);
	    }
	    break;
        case ESinCos3D:
        case ESinCosBDS3D:
            p = FADcos(x1)*FADsin(x2)+FADcos(x2)*FADsin(x3);
            break;
        case EGatica3D:
            p = FADsin(Pi*x1)*FADsin(Pi*x2)*FADsin(Pi*x3);
            break;
        case EKovasznay:
	    Re = 1./fvisco; //Reynolds number
            lambda = Re/2.- sqrt(Re*Re/4.+4.*Pi*Pi); // Parameter for Navier-Stokes solution
            p = -(1./2.)*FADexp(2.*lambda*x1);
            break;
        case EKovasznayCDG:
	    Re = 1./fvisco; //Reynolds number
            lambda = Re/2.- sqrt(Re*Re/4.+4.*Pi*Pi); // Parameter for Navier-Stokes solution
            flux[0] = 1. - FADexp(lambda*x1)*FADcos(2.*Pi*x2);
            flux[1] = (lambda/(2.*Pi))*FADexp(lambda*x1)*FADsin(2.*Pi*x2);
            p = -(1./2.)*FADexp(2.*lambda*x1);
            p += (1./2.)*(flux[0]*flux[0]+flux[1]*flux[1]);
            break;
        case EPconst:
            p = 0;
            break;
        default:
            DebugStop();
    }
    
}